

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int get_test_arg(int argc,char **argv,TEST_ARGS *args)

{
  int iVar1;
  undefined4 *in_RDX;
  long in_RSI;
  int in_EDI;
  int i;
  int ret;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  
  for (local_20 = 1; local_20 < in_EDI; local_20 = local_20 + 1) {
    if ((**(long **)(in_RSI + (long)local_20 * 8) == 0x3d53444145524854) ||
       (**(long **)(in_RSI + (long)local_20 * 8) == 0x3d73646165726874)) {
      iVar1 = atoi((char *)(*(long *)(in_RSI + (long)local_20 * 8) + 8));
      *(long *)(in_RDX + 4) = (long)iVar1;
    }
    else if ((**(short **)(in_RSI + (long)local_20 * 8) == 0x3d74) ||
            (**(short **)(in_RSI + (long)local_20 * 8) == 0x3d54)) {
      iVar1 = atoi((char *)(*(long *)(in_RSI + (long)local_20 * 8) + 2));
      *(long *)(in_RDX + 4) = (long)iVar1;
    }
    else if ((**(short **)(in_RSI + (long)local_20 * 8) == 0x3d6e) ||
            (**(short **)(in_RSI + (long)local_20 * 8) == 0x3d4e)) {
      iVar1 = atoi((char *)(*(long *)(in_RSI + (long)local_20 * 8) + 2));
      *(long *)(in_RDX + 2) = (long)iVar1;
    }
  }
  *in_RDX = 0;
  if (*(long *)(in_RDX + 4) < 1) {
    local_28 = 4;
  }
  else {
    local_28 = *(undefined8 *)(in_RDX + 4);
  }
  *(undefined8 *)(in_RDX + 4) = local_28;
  if (*(long *)(in_RDX + 2) < 1) {
    local_30 = 0x3039;
  }
  else {
    local_30 = *(undefined8 *)(in_RDX + 2);
  }
  *(undefined8 *)(in_RDX + 2) = local_30;
  return 0;
}

Assistant:

int get_test_arg(int argc, char **argv, TEST_ARGS *args)
{
    int ret = GML_ERROR;

    for (int i = 1; i < argc; i++) {
        if (memcmp(argv[i], "THREADS=", 8) == 0 || memcmp(argv[i], "threads=", 8) == 0) {
            args->num_threads = atoi(argv[i] + 8);
            continue;
        }

        if (memcmp(argv[i], "t=", 2) == 0 || memcmp(argv[i], "T=", 2) == 0) {
            args->num_threads = atoi(argv[i] + 2);
            continue;
        }

        if (memcmp(argv[i], "n=", 2) == 0 || memcmp(argv[i], "N=", 2) == 0) {
            args->N = atoi(argv[i] + 2);
            continue;
        }
    }

    args->ok = 0;
    args->num_threads = args->num_threads > 0 ? args->num_threads : 4;
    args->N = args->N > 0 ? args->N : 12345; 

    return ret;
}